

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webrtc_vad.c
# Opt level: O0

int WebRtcVad_set_mode(VadInst *handle,int mode)

{
  VadInstT *self;
  int mode_local;
  VadInst *handle_local;
  
  if (handle == (VadInst *)0x0) {
    handle_local._4_4_ = -1;
  }
  else if (*(int *)(handle + 0x2dc) == 0x2a) {
    handle_local._4_4_ = WebRtcVad_set_mode_core((VadInstT *)handle,mode);
  }
  else {
    handle_local._4_4_ = -1;
  }
  return handle_local._4_4_;
}

Assistant:

int WebRtcVad_set_mode(VadInst* handle, int mode) {
  VadInstT* self = (VadInstT*) handle;

  if (handle == NULL) {
    return -1;
  }
  if (self->init_flag != kInitCheck) {
    return -1;
  }

  return WebRtcVad_set_mode_core(self, mode);
}